

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O2

void hydro_kx_aead_init(uint8_t *aead_state,uint8_t *k,hydro_kx_state *state)

{
  hydro_hash_final(&state->h_st,k,0x20);
  mem_zero(aead_state + 8,0x28);
  builtin_memcpy(aead_state,"\x06kxx256",8);
  gimli_core_u8(aead_state,'\x01');
  mem_xor(aead_state,k,0x10);
  gimli_core_u8(aead_state,0xff);
  mem_xor(aead_state,k + 0x10,0x10);
  gimli_core_u8(aead_state,0xff);
  return;
}

Assistant:

static void
hydro_kx_aead_init(uint8_t aead_state[gimli_BLOCKBYTES], uint8_t k[hydro_kx_AEAD_KEYBYTES],
                   hydro_kx_state *state)
{
    static const uint8_t prefix[] = { 6, 'k', 'x', 'x', '2', '5', '6', 0 };

    hydro_hash_final(&state->h_st, k, hydro_kx_AEAD_KEYBYTES);

    mem_zero(aead_state + sizeof prefix, gimli_BLOCKBYTES - sizeof prefix);
    memcpy(aead_state, prefix, sizeof prefix);
    gimli_core_u8(aead_state, gimli_TAG_HEADER);

    COMPILER_ASSERT(hydro_kx_AEAD_KEYBYTES == 2 * gimli_RATE);
    mem_xor(aead_state, k, gimli_RATE);
    gimli_core_u8(aead_state, gimli_TAG_KEY);
    mem_xor(aead_state, k + gimli_RATE, gimli_RATE);
    gimli_core_u8(aead_state, gimli_TAG_KEY);
}